

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sort.h
# Opt level: O1

void Minisat::sort<Minisat::Option*,Minisat::Option::OptionLt>(void *array,uint size)

{
  undefined8 *puVar1;
  Option *y;
  undefined8 uVar2;
  bool bVar3;
  void *pvVar4;
  uint uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  undefined8 *puVar11;
  void *__dest;
  int iVar12;
  ulong uVar13;
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  OptionLt local_9e;
  OptionLt local_9d;
  uint local_9c;
  ulong local_98;
  void *local_90;
  ulong local_88;
  ulong local_80;
  long local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  long local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  
  local_80 = (ulong)size;
  if (0xf < (int)size) {
    if ((int)size < 0x21) {
      y = *(Option **)((long)array + (ulong)(size >> 1) * 8);
      uVar13 = 0xffffffffffffffff;
      uVar16 = (ulong)size;
      while( true ) {
        uVar13 = (ulong)(int)uVar13;
        puVar11 = (undefined8 *)(uVar13 * 8 + (long)array);
        do {
          uVar13 = uVar13 + 1;
          puVar1 = puVar11 + 1;
          puVar11 = puVar11 + 1;
          bVar3 = Option::OptionLt::operator()(&local_9e,(Option *)*puVar1,y);
        } while (bVar3);
        uVar16 = (ulong)(int)uVar16;
        do {
          lVar6 = uVar16 * 8;
          uVar16 = uVar16 - 1;
          bVar3 = Option::OptionLt::operator()(&local_9e,y,*(Option **)((long)array + lVar6 + -8));
        } while (bVar3);
        if ((long)uVar16 <= (long)uVar13) break;
        uVar2 = *puVar11;
        *puVar11 = *(undefined8 *)((long)array + uVar16 * 8);
        *(undefined8 *)((long)array + uVar16 * 8) = uVar2;
      }
      sort<Minisat::Option*,Minisat::Option::OptionLt>(array,uVar13 & 0xffffffff);
      sort<Minisat::Option*,Minisat::Option::OptionLt>(puVar11,size - (int)uVar13);
    }
    else {
      local_70 = local_80 * 8;
      pvVar4 = operator_new__(local_70);
      uVar13 = 0;
      uVar16 = 1;
      do {
        __dest = array;
        iVar12 = (int)uVar16;
        uVar10 = iVar12 * 2;
        local_88 = (ulong)uVar10;
        local_48 = (long)(int)uVar10;
        local_78 = (long)iVar12;
        local_60 = (ulong)(iVar12 - 1);
        local_58 = local_80 - local_78;
        uVar8 = 0;
        local_90 = pvVar4;
        local_68 = uVar13;
        local_50 = local_78;
        do {
          local_38 = (long)(int)uVar10;
          if ((long)local_80 < (long)(int)uVar10) {
            local_38 = local_80;
          }
          uVar15 = (uint)uVar8;
          uVar5 = (int)local_88 + uVar15;
          local_40 = (ulong)uVar5;
          if ((int)size < (int)uVar5) {
            local_40 = (ulong)size;
          }
          uVar16 = uVar8 + local_50;
          uVar5 = (uint)uVar16;
          uVar9 = (int)local_50 + uVar5;
          if ((int)size <= (int)uVar9) {
            uVar9 = size;
          }
          uVar17 = uVar8 & 0xffffffff;
          uVar13 = uVar16 & 0xffffffff;
          local_9c = uVar10;
          local_98 = uVar8;
          if ((long)uVar16 < (long)(int)uVar9 && 0 < (int)local_50) {
            do {
              iVar14 = (int)uVar17;
              iVar12 = (int)uVar13;
              bVar3 = Option::OptionLt::operator()
                                (&local_9d,*(Option **)((long)__dest + (long)iVar14 * 8),
                                 *(Option **)((long)__dest + (long)iVar12 * 8));
              lVar6 = (long)iVar12;
              if (bVar3) {
                lVar6 = (long)iVar14;
              }
              uVar15 = iVar14 + (uint)bVar3;
              uVar17 = (ulong)uVar15;
              uVar5 = iVar12 + (uint)!bVar3;
              uVar13 = (ulong)uVar5;
              *(undefined8 *)((long)local_90 + uVar8 * 8) =
                   *(undefined8 *)((long)__dest + lVar6 * 8);
              uVar8 = uVar8 + 1;
            } while (((long)(int)uVar15 < (long)uVar16) && ((int)uVar5 < (int)uVar9));
          }
          array = local_90;
          uVar7 = (uint)uVar8;
          if ((long)(int)uVar15 < (long)uVar16) {
            memcpy((void *)((long)(int)uVar7 * 8 + (long)local_90),
                   (void *)((long)__dest + (long)(int)uVar15 * 8),
                   (ulong)(((int)local_60 + (int)local_98) - uVar15) * 8 + 8);
            uVar7 = (uVar7 + (int)local_78) - uVar15;
          }
          if ((int)uVar5 < (int)uVar9) {
            memcpy((void *)((long)(int)uVar7 * 8 + (long)array),
                   (void *)((long)__dest + (long)(int)uVar5 * 8),
                   (ulong)((int)local_40 + ~uVar5) * 8 + 8);
            uVar7 = ((int)local_38 + uVar7) - uVar5;
          }
          uVar16 = local_88;
          uVar8 = local_98 + local_48;
          local_78 = local_78 + local_48;
          iVar12 = (int)local_88;
          uVar10 = local_9c + iVar12;
        } while ((long)uVar8 < local_58);
        if ((int)uVar7 < (int)size) {
          memcpy((void *)((long)(int)uVar7 * 8 + (long)array),
                 (void *)((long)__dest + (long)(int)uVar7 * 8),(ulong)(~uVar7 + size) * 8 + 8);
        }
        uVar13 = (ulong)((int)local_68 + 1);
        pvVar4 = __dest;
      } while (iVar12 < (int)size);
      if ((local_68 & 1) == 0) {
        memcpy(__dest,array,local_70);
        __dest = array;
      }
      if (__dest != (void *)0x0) {
        operator_delete__(__dest);
      }
    }
    return;
  }
  selectionSort<Minisat::Option*,Minisat::Option::OptionLt>(array,local_80);
  return;
}

Assistant:

void sort(T *array, int size, LessThan lt)
{
    if (size <= 15) {
        selectionSort(array, size, lt);
    } else if (size > 32) {
        mergesort(array, size, lt);
    } else {
        T pivot = array[size / 2];
        T tmp;
        int i = -1;
        int j = size;

        for (;;) {
            do
                i++;
            while (lt(array[i], pivot));
            do
                j--;
            while (lt(pivot, array[j]));

            if (i >= j) break;

            tmp = array[i];
            array[i] = array[j];
            array[j] = tmp;
        }

        sort(array, i, lt);
        sort(&array[i], size - i, lt);
    }
}